

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

void Amap_LibWrite(FILE *pFile,Amap_Lib_t *pLib,int fPrintDsd)

{
  Amap_Gat_t *pGate;
  int i;
  
  fprintf((FILE *)pFile,"# The genlib library \"%s\".\n",pLib->pName);
  for (i = 0; i < pLib->vGates->nSize; i = i + 1) {
    pGate = (Amap_Gat_t *)Vec_PtrEntry(pLib->vGates,i);
    Amap_LibWriteGate(pFile,pGate,fPrintDsd);
  }
  return;
}

Assistant:

void Amap_LibWrite( FILE * pFile, Amap_Lib_t * pLib, int fPrintDsd )
{
    Amap_Gat_t * pGate;
    int i;
    fprintf( pFile, "# The genlib library \"%s\".\n", pLib->pName );
    Amap_LibForEachGate( pLib, pGate, i )
        Amap_LibWriteGate( pFile, pGate, fPrintDsd );
}